

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O3

void make_angry_shk(monst *shkp,xchar ox,xchar oy)

{
  char cVar1;
  char cVar2;
  short sVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  int *piVar7;
  char *pcVar8;
  
  sVar3 = *(short *)((long)&shkp[0x1b].misc_worn_check + 2);
  iVar6 = (int)sVar3;
  if (sVar3 == 0) {
    iVar4 = 0;
    iVar6 = *(int *)&shkp[0x1b].field_0x60;
    if (*(int *)&shkp[0x1b].field_0x60 == 0) {
      iVar6 = 0;
      iVar4._0_1_ = shkp[0x1b].mfleetim;
      iVar4._1_1_ = shkp[0x1b].wormno;
      iVar4._2_1_ = shkp[0x1b].weapon_check;
      iVar4._3_1_ = shkp[0x1b].field_0x67;
      if (iVar4 == 0) {
        iVar4 = 0;
        if (shkp[0x1b].mappearance == 0) goto LAB_0023c064;
      }
      else {
        iVar4 = 0;
        iVar6 = 0;
      }
    }
  }
  else {
    piVar7 = (int *)(*(long *)&shkp[0x1b].mnum + 0xc);
    iVar4 = 0;
    do {
      iVar4 = iVar4 + *piVar7 * piVar7[-1];
      piVar7 = piVar7 + 4;
      iVar6 = iVar6 + -1;
    } while (iVar6 != 0);
    iVar6 = *(int *)&shkp[0x1b].field_0x60;
  }
  iVar4 = (iVar6 + iVar4 + *(int *)&shkp[0x1b].mfleetim + *(int *)&shkp[0x1b].mtame) -
          shkp[0x1b].mappearance;
  iVar6 = 0;
  if (0 < iVar4) {
    iVar6 = iVar4;
  }
  shkp[0x1b].mtame = (char)iVar6;
  shkp[0x1b].m_ap_type = (char)((uint)iVar6 >> 8);
  shkp[0x1b].mfrozen = (char)((uint)iVar6 >> 0x10);
  shkp[0x1b].mblinded = (char)((uint)iVar6 >> 0x18);
  setpaid(shkp);
LAB_0023c064:
  cVar1 = shkp->mx;
  cVar2 = shkp->my;
  if ((((byte)oy < 0x15 && (byte)(ox - 1U) < 0x4f) && ((viz_array[(byte)oy][(byte)ox] & 2U) != 0))
     && ((viz_array[cVar2][cVar1] & 2U) == 0)) {
    shkp->mx = ox;
    shkp->my = oy;
  }
  pcVar5 = Monnam(shkp);
  pcVar8 = "gets angry";
  if ((*(uint *)&shkp->field_0x60 >> 0x16 & 1) == 0) {
    pcVar8 = "is furious";
  }
  pline("%s %s!",pcVar5,pcVar8);
  shkp->mx = cVar1;
  shkp->my = cVar2;
  hot_pursuit(shkp);
  return;
}

Assistant:

void make_angry_shk(struct monst *shkp, xchar ox, xchar oy)
{
	xchar sx, sy;
	struct eshk *eshkp = ESHK(shkp);

	/* all pending shop transactions are now "past due" */
	if (eshkp->billct || eshkp->debit || eshkp->loan || eshkp->credit) {
	    eshkp->robbed += (addupbill(shkp) + eshkp->debit + eshkp->loan);
	    eshkp->robbed -= eshkp->credit;
	    if (eshkp->robbed < 0L) eshkp->robbed = 0L;
	    /* billct, debit, loan, and credit will be cleared by setpaid */
	    setpaid(shkp);
	}

	/* If you just used a wand of teleportation to send the shk away, you
	   might not be able to see her any more.  Monnam would yield "it",
	   which makes this message look pretty silly, so temporarily restore
	   her original location during the call to Monnam. */
	sx = shkp->mx,  sy = shkp->my;
	if (isok(ox, oy) && cansee(ox, oy) && !cansee(sx, sy))
		shkp->mx = ox,  shkp->my = oy;
	pline("%s %s!", Monnam(shkp),
	      !ANGRY(shkp) ? "gets angry" : "is furious");
	shkp->mx = sx,  shkp->my = sy;
	hot_pursuit(shkp);
}